

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSConverter.cpp
# Opt level: O1

void __thiscall Assimp::Discreet3DSImporter::ConvertMeshes(Discreet3DSImporter *this,aiScene *pcOut)

{
  vector<unsigned_int,std::allocator<unsigned_int>> *this_00;
  uint uVar1;
  pointer pMVar2;
  pointer pMVar3;
  iterator __position;
  pointer paVar4;
  undefined1 auVar5 [16];
  bool bVar6;
  float fVar7;
  aiScene *paVar8;
  Scene *pSVar9;
  ulong uVar10;
  ulong uVar11;
  ulong *puVar12;
  aiMesh *paVar13;
  aiFace *paVar14;
  aiVector3D *paVar15;
  uint *puVar16;
  long lVar17;
  aiMesh **__s;
  runtime_error *this_01;
  int iVar18;
  uint uVar19;
  aiFace *paVar20;
  pointer puVar21;
  int iVar22;
  ulong uVar23;
  uint uVar24;
  int iVar25;
  char *pcVar26;
  char *pcVar27;
  pointer pMVar28;
  bool bVar29;
  uint iNum;
  aiMesh *meshOut;
  vector<aiMesh_*,_std::allocator<aiMesh_*>_> avOutMeshes;
  unique_ptr<std::vector<unsigned_int,_std::allocator<unsigned_int>_>[],_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>[]>_>
  aiSplit;
  aiString name;
  int local_4c0;
  uint local_4bc;
  aiMesh *local_4b8;
  int local_4b0;
  uint local_4ac;
  vector<aiMesh_*,_std::allocator<aiMesh_*>_> local_4a8;
  long local_488;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_480 [2];
  undefined1 local_470 [20];
  uint local_45c;
  ulong local_458;
  aiScene *local_450;
  Discreet3DSImporter *local_448;
  ulong local_440;
  uint local_434;
  char local_430;
  char local_42f [1023];
  
  local_4a8.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_4a8.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (aiMesh **)0x0;
  local_4a8.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (aiMesh **)0x0;
  local_450 = pcOut;
  std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::reserve
            (&local_4a8,
             ((long)(this->mScene->mMeshes).
                    super__Vector_base<Assimp::D3DS::Mesh,_std::allocator<Assimp::D3DS::Mesh>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(this->mScene->mMeshes).
                    super__Vector_base<Assimp::D3DS::Mesh,_std::allocator<Assimp::D3DS::Mesh>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 3) * 0x97b425ed097b426);
  local_434 = 0;
  local_430 = '\0';
  memset(local_42f,0x1b,0x3ff);
  pSVar9 = this->mScene;
  pMVar28 = (pSVar9->mMeshes).
            super__Vector_base<Assimp::D3DS::Mesh,_std::allocator<Assimp::D3DS::Mesh>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (pMVar28 ==
      (pSVar9->mMeshes).super__Vector_base<Assimp::D3DS::Mesh,_std::allocator<Assimp::D3DS::Mesh>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    bVar29 = true;
  }
  else {
    local_4c0 = 0;
    local_4b0 = 0;
    local_448 = this;
    do {
      pMVar2 = (pSVar9->mMaterials).
               super__Vector_base<Assimp::D3DS::Material,_std::allocator<Assimp::D3DS::Material>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pMVar3 = (pSVar9->mMaterials).
               super__Vector_base<Assimp::D3DS::Material,_std::allocator<Assimp::D3DS::Material>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      uVar23 = ((long)pMVar3 - (long)pMVar2) / 0x2b8;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = uVar23;
      uVar10 = SUB168(auVar5 * ZEXT816(0x18),0);
      uVar11 = uVar10 + 8;
      if (0xfffffffffffffff7 < uVar10) {
        uVar11 = 0xffffffffffffffff;
      }
      if (SUB168(auVar5 * ZEXT816(0x18),8) != 0) {
        uVar11 = 0xffffffffffffffff;
      }
      puVar12 = (ulong *)operator_new__(uVar11);
      *puVar12 = uVar23;
      if (pMVar3 != pMVar2) {
        memset((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(puVar12 + 1),0,
               ((uVar23 * 0x18 - 0x18) / 0x18) * 0x18 + 0x18);
      }
      local_4ac = 1;
      pcVar26 = &local_430;
      iVar18 = local_4b0;
      if (local_4b0 < 0) {
        local_430 = '-';
        iVar18 = -local_4b0;
        local_4ac = 2;
        pcVar26 = local_42f;
      }
      local_4b0 = local_4b0 + 1;
      iVar25 = 1000000000;
      bVar29 = false;
      do {
        pcVar27 = pcVar26;
        if (0x3ff < local_4ac) break;
        iVar22 = iVar18 % iVar25;
        if (((bVar29) || (iVar25 == 1)) || ((int)((long)iVar18 / (long)iVar25) != 0)) {
          pcVar27 = pcVar26 + 1;
          local_4ac = local_4ac + 1;
          *pcVar26 = (char)((long)iVar18 / (long)iVar25) + '0';
          bVar29 = true;
          pcVar26 = pcVar27;
          iVar18 = iVar22;
          if (iVar25 != 1) goto LAB_006a092e;
          bVar6 = false;
          iVar25 = 1;
        }
        else {
LAB_006a092e:
          iVar25 = iVar25 / 10;
          bVar6 = true;
          pcVar27 = pcVar26;
        }
        pcVar26 = pcVar27;
      } while (bVar6);
      *pcVar27 = '\0';
      local_4ac = local_4ac - 1;
      local_4bc = 0;
      local_480[0] = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(puVar12 + 1);
      local_434 = local_4ac;
      for (puVar16 = (pMVar28->mFaceMaterials).
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start;
          puVar16 !=
          (pMVar28->mFaceMaterials).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_finish; puVar16 = puVar16 + 1) {
        this_00 = (vector<unsigned_int,std::allocator<unsigned_int>> *)(local_480[0] + *puVar16);
        __position._M_current = *(uint **)(this_00 + 8);
        if (__position._M_current == *(uint **)(this_00 + 0x10)) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>(this_00,__position,&local_4bc);
        }
        else {
          *__position._M_current = local_4bc;
          *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 4;
        }
        local_4bc = local_4bc + 1;
      }
      if ((this->mScene->mMaterials).
          super__Vector_base<Assimp::D3DS::Material,_std::allocator<Assimp::D3DS::Material>_>.
          _M_impl.super__Vector_impl_data._M_finish !=
          (this->mScene->mMaterials).
          super__Vector_base<Assimp::D3DS::Material,_std::allocator<Assimp::D3DS::Material>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        local_440 = (ulong)local_4ac;
        uVar23 = 0;
        do {
          local_488 = uVar23 * 3;
          if (local_480[0][uVar23].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start !=
              local_480[0][uVar23].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_finish) {
            local_458 = uVar23;
            paVar13 = (aiMesh *)operator_new(0x520);
            paVar13->mPrimitiveTypes = 0;
            paVar13->mNumVertices = 0;
            paVar13->mNumFaces = 0;
            memset(&paVar13->mVertices,0,0xcc);
            paVar13->mBones = (aiBone **)0x0;
            paVar13->mMaterialIndex = 0;
            (paVar13->mName).length = 0;
            (paVar13->mName).data[0] = '\0';
            memset((paVar13->mName).data + 1,0x1b,0x3ff);
            uVar23 = local_440;
            paVar13->mNumAnimMeshes = 0;
            paVar13->mAnimMeshes = (aiAnimMesh **)0x0;
            paVar13->mMethod = 0;
            (paVar13->mAABB).mMin.x = 0.0;
            (paVar13->mAABB).mMin.y = 0.0;
            (paVar13->mAABB).mMin.z = 0.0;
            (paVar13->mAABB).mMax.x = 0.0;
            (paVar13->mAABB).mMax.y = 0.0;
            (paVar13->mAABB).mMax.z = 0.0;
            paVar13->mTextureCoords[0] = (aiVector3D *)0x0;
            paVar13->mTextureCoords[1] = (aiVector3D *)0x0;
            paVar13->mTextureCoords[2] = (aiVector3D *)0x0;
            paVar13->mTextureCoords[3] = (aiVector3D *)0x0;
            paVar13->mTextureCoords[4] = (aiVector3D *)0x0;
            paVar13->mTextureCoords[5] = (aiVector3D *)0x0;
            paVar13->mTextureCoords[6] = (aiVector3D *)0x0;
            paVar13->mTextureCoords[7] = (aiVector3D *)0x0;
            paVar13->mNumUVComponents[0] = 0;
            paVar13->mNumUVComponents[1] = 0;
            paVar13->mNumUVComponents[2] = 0;
            paVar13->mNumUVComponents[3] = 0;
            paVar13->mNumUVComponents[4] = 0;
            paVar13->mNumUVComponents[5] = 0;
            paVar13->mNumUVComponents[6] = 0;
            paVar13->mNumUVComponents[7] = 0;
            paVar13->mColors[0] = (aiColor4D *)0x0;
            paVar13->mColors[1] = (aiColor4D *)0x0;
            paVar13->mColors[2] = (aiColor4D *)0x0;
            paVar13->mColors[3] = (aiColor4D *)0x0;
            paVar13->mColors[4] = (aiColor4D *)0x0;
            paVar13->mColors[5] = (aiColor4D *)0x0;
            paVar13->mColors[6] = (aiColor4D *)0x0;
            paVar13->mColors[7] = (aiColor4D *)0x0;
            (paVar13->mName).length = local_4ac;
            local_4b8 = paVar13;
            memcpy((paVar13->mName).data,&local_430,local_440);
            (paVar13->mName).data[uVar23] = '\0';
            paVar13->mPrimitiveTypes = 4;
            paVar13->mMaterialIndex = (uint)local_458;
            paVar13->mColors[0] = (aiColor4D *)pMVar28;
            if (local_4a8.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_4a8.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<aiMesh*,std::allocator<aiMesh*>>::_M_realloc_insert<aiMesh*const&>
                        ((vector<aiMesh*,std::allocator<aiMesh*>> *)&local_4a8,
                         (iterator)
                         local_4a8.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                         super__Vector_impl_data._M_finish,&local_4b8);
            }
            else {
              *local_4a8.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
               super__Vector_impl_data._M_finish = paVar13;
              local_4a8.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_4a8.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
            paVar13 = local_4b8;
            uVar19 = (uint)((ulong)((long)(&(local_480[0]->
                                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                            )._M_impl.super__Vector_impl_data._M_finish)[local_488]
                                   - (long)(&(local_480[0]->
                                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                             )._M_impl.super__Vector_impl_data._M_start)[local_488])
                           >> 2);
            local_4b8->mNumFaces = uVar19;
            local_4b8->mNumVertices = uVar19 * 3;
            uVar23 = (ulong)local_4b8->mNumFaces;
            puVar12 = (ulong *)operator_new__(uVar23 * 0x10 + 8);
            *puVar12 = uVar23;
            paVar14 = (aiFace *)(puVar12 + 1);
            if (uVar23 != 0) {
              paVar20 = paVar14;
              do {
                paVar20->mNumIndices = 0;
                paVar20->mIndices = (uint *)0x0;
                paVar20 = paVar20 + 1;
              } while (paVar20 != paVar14 + uVar23);
            }
            paVar13->mFaces = paVar14;
            local_4c0 = local_4c0 + paVar13->mNumFaces;
            uVar23 = (ulong)paVar13->mNumVertices;
            paVar15 = (aiVector3D *)operator_new__(uVar23 * 0xc);
            if (uVar23 != 0) {
              memset(paVar15,0,((uVar23 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
            }
            paVar13->mVertices = paVar15;
            uVar23 = (ulong)paVar13->mNumVertices;
            paVar15 = (aiVector3D *)operator_new__(uVar23 * 0xc);
            if (uVar23 != 0) {
              memset(paVar15,0,((uVar23 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
            }
            paVar13->mNormals = paVar15;
            if ((pMVar28->mTexCoords).
                super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                super__Vector_impl_data._M_finish !=
                (pMVar28->mTexCoords).
                super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                super__Vector_impl_data._M_start) {
              uVar23 = (ulong)paVar13->mNumVertices;
              paVar15 = (aiVector3D *)operator_new__(uVar23 * 0xc);
              if (uVar23 != 0) {
                memset(paVar15,0,((uVar23 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
              }
              paVar13->mTextureCoords[0] = paVar15;
            }
            puVar21 = (&(local_480[0]->
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                        super__Vector_impl_data._M_start)[local_488];
            uVar23 = local_458;
            this = local_448;
            if ((&(local_480[0]->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                  _M_impl.super__Vector_impl_data._M_finish)[local_488] != puVar21) {
              uVar10 = 0;
              uVar19 = 0;
              do {
                uVar24 = uVar19;
                uVar19 = puVar21[uVar10];
                paVar14 = local_4b8->mFaces;
                puVar16 = (uint *)operator_new__(0xc);
                paVar14[uVar10].mIndices = puVar16;
                paVar14[uVar10].mNumIndices = 3;
                lVar17 = 0;
                do {
                  uVar1 = (pMVar28->super_MeshWithSmoothingGroups<Assimp::D3DS::Face>).mFaces.
                          super__Vector_base<Assimp::D3DS::Face,_std::allocator<Assimp::D3DS::Face>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar19].
                          super_FaceWithSmoothingGroup.mIndices[lVar17];
                  paVar4 = (pMVar28->super_MeshWithSmoothingGroups<Assimp::D3DS::Face>).mPositions.
                           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  paVar15 = local_4b8->mVertices;
                  uVar23 = (ulong)uVar24 + lVar17 & 0xffffffff;
                  paVar15[uVar23].z = *(float *)((long)(paVar4 + uVar1) + 8);
                  paVar4 = paVar4 + uVar1;
                  fVar7 = paVar4->y;
                  paVar15 = paVar15 + uVar23;
                  paVar15->x = paVar4->x;
                  paVar15->y = fVar7;
                  paVar4 = (pMVar28->super_MeshWithSmoothingGroups<Assimp::D3DS::Face>).mNormals.
                           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  paVar15 = local_4b8->mNormals;
                  paVar15[uVar23].z = paVar4[uVar1].z;
                  paVar4 = paVar4 + uVar1;
                  fVar7 = paVar4->y;
                  paVar15 = paVar15 + uVar23;
                  paVar15->x = paVar4->x;
                  paVar15->y = fVar7;
                  paVar4 = (pMVar28->mTexCoords).
                           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  if ((pMVar28->mTexCoords).
                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_finish != paVar4) {
                    paVar15 = local_4b8->mTextureCoords[0];
                    paVar15[uVar23].z = paVar4[uVar1].z;
                    fVar7 = paVar4[uVar1].y;
                    paVar15 = paVar15 + uVar23;
                    paVar15->x = paVar4[uVar1].x;
                    paVar15->y = fVar7;
                  }
                  paVar14[uVar10].mIndices[lVar17] = (uint)((ulong)uVar24 + lVar17);
                  lVar17 = lVar17 + 1;
                } while (lVar17 != 3);
                uVar10 = (ulong)((int)uVar10 + 1);
                puVar21 = (&(local_480[0]->
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                            .super__Vector_impl_data._M_start)[local_488];
                uVar23 = local_458;
                this = local_448;
                uVar19 = uVar24 + 3;
                local_45c = uVar24;
              } while (uVar10 < (ulong)((long)(&(local_480[0]->
                                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                )._M_impl.super__Vector_impl_data._M_finish)
                                              [local_488] - (long)puVar21 >> 2));
            }
          }
          uVar23 = (ulong)((int)uVar23 + 1);
          uVar10 = ((long)(this->mScene->mMaterials).
                          super__Vector_base<Assimp::D3DS::Material,_std::allocator<Assimp::D3DS::Material>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->mScene->mMaterials).
                          super__Vector_base<Assimp::D3DS::Material,_std::allocator<Assimp::D3DS::Material>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x66fd0eb66fd0eb67;
        } while (uVar23 <= uVar10 && uVar10 - uVar23 != 0);
      }
      if (local_480[0] != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
        std::default_delete<std::vector<unsigned_int,std::allocator<unsigned_int>>[]>::operator()
                  ((default_delete<std::vector<unsigned_int,std::allocator<unsigned_int>>[]> *)
                   local_480,local_480[0]);
      }
      pMVar28 = pMVar28 + 1;
      pSVar9 = this->mScene;
    } while (pMVar28 !=
             (pSVar9->mMeshes).
             super__Vector_base<Assimp::D3DS::Mesh,_std::allocator<Assimp::D3DS::Mesh>_>._M_impl.
             super__Vector_impl_data._M_finish);
    bVar29 = local_4c0 == 0;
  }
  paVar8 = local_450;
  uVar23 = (long)local_4a8.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_4a8.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                 super__Vector_impl_data._M_start & 0x7fffffff8;
  local_450->mNumMeshes =
       (uint)((ulong)((long)local_4a8.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)local_4a8.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl
                           .super__Vector_impl_data._M_start) >> 3);
  __s = (aiMesh **)operator_new__(uVar23);
  memset(__s,0,uVar23);
  paVar8->mMeshes = __s;
  if (paVar8->mNumMeshes != 0) {
    uVar23 = 0;
    do {
      paVar8->mMeshes[uVar23] =
           local_4a8.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
           super__Vector_impl_data._M_start[uVar23];
      uVar23 = uVar23 + 1;
    } while (uVar23 < paVar8->mNumMeshes);
  }
  if (bVar29) {
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_480[0] = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_470;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_480,"No faces loaded. The mesh is empty","");
    std::runtime_error::runtime_error(this_01,(string *)local_480);
    *(undefined ***)this_01 = &PTR__runtime_error_0082bce0;
    __cxa_throw(this_01,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  if (local_4a8.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_4a8.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_4a8.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_4a8.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void Discreet3DSImporter::ConvertMeshes(aiScene* pcOut)
{
    std::vector<aiMesh*> avOutMeshes;
    avOutMeshes.reserve(mScene->mMeshes.size() * 2);

    unsigned int iFaceCnt = 0,num = 0;
    aiString name;

    // we need to split all meshes by their materials
    for (std::vector<D3DS::Mesh>::iterator i =  mScene->mMeshes.begin(); i != mScene->mMeshes.end();++i)    {
        std::unique_ptr< std::vector<unsigned int>[] > aiSplit(new std::vector<unsigned int>[mScene->mMaterials.size()]);

        name.length = ASSIMP_itoa10(name.data,num++);

        unsigned int iNum = 0;
        for (std::vector<unsigned int>::const_iterator a =  (*i).mFaceMaterials.begin();
            a != (*i).mFaceMaterials.end();++a,++iNum)
        {
            aiSplit[*a].push_back(iNum);
        }
        // now generate submeshes
        for (unsigned int p = 0; p < mScene->mMaterials.size();++p)
        {
            if (aiSplit[p].empty()) {
                continue;
            }
            aiMesh* meshOut = new aiMesh();
            meshOut->mName = name;
            meshOut->mPrimitiveTypes = aiPrimitiveType_TRIANGLE;

            // be sure to setup the correct material index
            meshOut->mMaterialIndex = p;

            // use the color data as temporary storage
            meshOut->mColors[0] = (aiColor4D*)(&*i);
            avOutMeshes.push_back(meshOut);

            // convert vertices
            meshOut->mNumFaces = (unsigned int)aiSplit[p].size();
            meshOut->mNumVertices = meshOut->mNumFaces*3;

            // allocate enough storage for faces
            meshOut->mFaces = new aiFace[meshOut->mNumFaces];
            iFaceCnt += meshOut->mNumFaces;

            meshOut->mVertices = new aiVector3D[meshOut->mNumVertices];
            meshOut->mNormals  = new aiVector3D[meshOut->mNumVertices];
            if ((*i).mTexCoords.size())
            {
                meshOut->mTextureCoords[0] = new aiVector3D[meshOut->mNumVertices];
            }
            for (unsigned int q = 0, base = 0; q < aiSplit[p].size();++q)
            {
                unsigned int index = aiSplit[p][q];
                aiFace& face = meshOut->mFaces[q];

                face.mIndices = new unsigned int[3];
                face.mNumIndices = 3;

                for (unsigned int a = 0; a < 3;++a,++base)
                {
                    unsigned int idx = (*i).mFaces[index].mIndices[a];
                    meshOut->mVertices[base]  = (*i).mPositions[idx];
                    meshOut->mNormals [base]  = (*i).mNormals[idx];

                    if ((*i).mTexCoords.size())
                        meshOut->mTextureCoords[0][base] = (*i).mTexCoords[idx];

                    face.mIndices[a] = base;
                }
            }
        }
    }

    // Copy them to the output array
    pcOut->mNumMeshes = (unsigned int)avOutMeshes.size();
    pcOut->mMeshes = new aiMesh*[pcOut->mNumMeshes]();
    for (unsigned int a = 0; a < pcOut->mNumMeshes;++a) {
        pcOut->mMeshes[a] = avOutMeshes[a];
    }

    // We should have at least one face here
    if (!iFaceCnt) {
        throw DeadlyImportError("No faces loaded. The mesh is empty");
    }
}